

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_DeletedKey_Test<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_DeletedKey_Test<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  bool bVar1;
  AssertHelper *this_00;
  char *pcVar2;
  uint *lhs;
  long in_RDI;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  key_type *in_stack_fffffffffffffdd8;
  HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffde0;
  uint *in_stack_fffffffffffffde8;
  char *in_stack_fffffffffffffdf0;
  char *in_stack_fffffffffffffdf8;
  int iVar3;
  char *in_stack_fffffffffffffe00;
  undefined8 in_stack_fffffffffffffe08;
  Type type;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_fffffffffffffe58;
  AssertHelper *in_stack_fffffffffffffe60;
  AssertionResult local_188;
  key_type local_174;
  size_type local_160;
  undefined4 local_154;
  AssertionResult local_150;
  key_type local_13c;
  size_type local_128;
  undefined4 local_11c;
  AssertionResult local_118 [3];
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_ffffffffffffff20;
  
  type = (Type)((ulong)in_stack_fffffffffffffe08 >> 0x20);
  bVar1 = google::
          HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::supports_deleted_key
                    ((HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                      *)(in_RDI + 0x10));
  if (bVar1) {
    this_00 = (AssertHelper *)(in_RDI + 0x10);
    HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::UniqueObject(in_stack_fffffffffffffde0,(int)((ulong)in_stack_fffffffffffffdd8 >> 0x20));
    google::
    BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(in_stack_ffffffffffffff20,
             (value_type *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::UniqueObject(in_stack_fffffffffffffde0,(int)((ulong)in_stack_fffffffffffffdd8 >> 0x20));
    google::
    BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(in_stack_ffffffffffffff20,
             (value_type *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::UniqueKey(in_stack_fffffffffffffde0,(int)((ulong)in_stack_fffffffffffffdd8 >> 0x20));
    google::
    BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::set_deleted_key((BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                       *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
    google::
    BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::deleted_key((BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   *)0xe611d8);
    HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::UniqueKey(in_stack_fffffffffffffde0,(int)((ulong)in_stack_fffffffffffffdd8 >> 0x20));
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              (in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,(int *)in_stack_fffffffffffffde8,
               (int *)in_stack_fffffffffffffde0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool
                      ((AssertionResult *)&stack0xffffffffffffff20);
    if (!bVar1) {
      testing::Message::Message((Message *)this_00);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0xe61254);
      type = (Type)((ulong)pcVar2 >> 0x20);
      testing::internal::AssertHelper::AssertHelper
                (this_00,type,in_stack_fffffffffffffe00,
                 (int)((ulong)in_stack_fffffffffffffdf8 >> 0x20),in_stack_fffffffffffffdf0);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffe60,(Message *)in_stack_fffffffffffffe58._M_head_impl);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffde0);
      testing::Message::~Message((Message *)0xe612b1);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xe6131f);
    local_11c = 2;
    local_128 = google::
                BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::size((BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)0xe61338);
    testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
              (in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
               (unsigned_long *)in_stack_fffffffffffffde0);
    iVar3 = (int)((ulong)in_stack_fffffffffffffdf8 >> 0x20);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_118);
    if (!bVar1) {
      testing::Message::Message((Message *)this_00);
      in_stack_fffffffffffffe00 =
           testing::AssertionResult::failure_message((AssertionResult *)0xe613b1);
      testing::internal::AssertHelper::AssertHelper
                (this_00,type,in_stack_fffffffffffffe00,iVar3,in_stack_fffffffffffffdf0);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffe60,(Message *)in_stack_fffffffffffffe58._M_head_impl);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffde0);
      testing::Message::~Message((Message *)0xe6140e);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xe6147f);
    pcVar2 = (char *)(in_RDI + 0x10);
    local_13c = HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueKey(in_stack_fffffffffffffde0,
                            (int)((ulong)in_stack_fffffffffffffdd8 >> 0x20));
    google::
    BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::erase((BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
    local_154 = 1;
    local_160 = google::
                BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::size((BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)0xe614cc);
    testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
              (pcVar2,in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
               (unsigned_long *)in_stack_fffffffffffffde0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_150);
    if (!bVar1) {
      testing::Message::Message((Message *)this_00);
      in_stack_fffffffffffffdf0 =
           testing::AssertionResult::failure_message((AssertionResult *)0xe61545);
      testing::internal::AssertHelper::AssertHelper
                (this_00,type,in_stack_fffffffffffffe00,(int)((ulong)pcVar2 >> 0x20),
                 in_stack_fffffffffffffdf0);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffe60,(Message *)in_stack_fffffffffffffe58._M_head_impl);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffde0);
      testing::Message::~Message((Message *)0xe615a2);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xe61613);
    lhs = (uint *)(in_RDI + 0x10);
    local_174 = HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueKey(in_stack_fffffffffffffde0,
                            (int)((ulong)in_stack_fffffffffffffdd8 >> 0x20));
    google::
    BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::set_deleted_key((BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                       *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
    iVar3 = (int)((ulong)in_stack_fffffffffffffdd8 >> 0x20);
    google::
    BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::deleted_key((BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   *)0xe61655);
    HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::UniqueKey(in_stack_fffffffffffffde0,iVar3);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              (pcVar2,in_stack_fffffffffffffdf0,(int *)lhs,(int *)in_stack_fffffffffffffde0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_188);
    if (!bVar1) {
      testing::Message::Message((Message *)this_00);
      in_stack_fffffffffffffde0 =
           (HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            *)testing::AssertionResult::failure_message((AssertionResult *)0xe616e3);
      testing::internal::AssertHelper::AssertHelper
                (this_00,type,in_stack_fffffffffffffe00,(int)((ulong)pcVar2 >> 0x20),
                 in_stack_fffffffffffffdf0);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffe60,(Message *)in_stack_fffffffffffffe58._M_head_impl);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffde0);
      testing::Message::~Message((Message *)0xe61740);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xe617ae);
    google::
    BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::size((BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            *)0xe617c4);
    testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
              (pcVar2,in_stack_fffffffffffffdf0,lhs,(unsigned_long *)in_stack_fffffffffffffde0);
    iVar3 = (int)((ulong)pcVar2 >> 0x20);
    bVar1 = testing::AssertionResult::operator_cast_to_bool
                      ((AssertionResult *)&stack0xfffffffffffffe50);
    if (!bVar1) {
      testing::Message::Message((Message *)this_00);
      testing::AssertionResult::failure_message((AssertionResult *)0xe61828);
      testing::internal::AssertHelper::AssertHelper
                (this_00,type,in_stack_fffffffffffffe00,iVar3,in_stack_fffffffffffffdf0);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffe60,(Message *)in_stack_fffffffffffffe58._M_head_impl);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffde0);
      testing::Message::~Message((Message *)0xe61874);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xe618d6);
  }
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, DeletedKey) {
  if (!this->ht_.supports_deleted_key()) return;
  this->ht_.insert(this->UniqueObject(10));
  this->ht_.insert(this->UniqueObject(20));
  this->ht_.set_deleted_key(this->UniqueKey(1));
  EXPECT_EQ(this->ht_.deleted_key(), this->UniqueKey(1));
  EXPECT_EQ(2u, this->ht_.size());
  this->ht_.erase(this->UniqueKey(20));
  EXPECT_EQ(1u, this->ht_.size());

  // Changing the deleted key is fine.
  this->ht_.set_deleted_key(this->UniqueKey(2));
  EXPECT_EQ(this->ht_.deleted_key(), this->UniqueKey(2));
  EXPECT_EQ(1u, this->ht_.size());
}